

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetProperty_InternalSimple
               (Var instance,RecyclableObject *object,PropertyId propertyId,Var *value,
               ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyQueryFlags val;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  int local_34;
  PropertyQueryFlags result;
  BOOL foundProperty;
  ScriptContext *requestContext_local;
  Var *value_local;
  RecyclableObject *pRStack_18;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  Var instance_local;
  
  local_34 = 0;
  pRStack_18 = object;
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x72f,"(value != nullptr)","value != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  do {
    BVar3 = IsNull(pRStack_18);
    if (BVar3 != 0) {
LAB_00f923f3:
      if (local_34 == 0) {
        pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
        *value = pRVar5;
      }
      return local_34;
    }
    val = (*(pRStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x12])
                    (pRStack_18,instance,(ulong)(uint)propertyId,value,0,requestContext);
    if (val != Property_NotFound) {
      local_34 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
      goto LAB_00f923f3;
    }
    BVar3 = RecyclableObject::SkipsPrototype(pRStack_18);
    if (BVar3 != 0) goto LAB_00f923f3;
    pRStack_18 = GetPrototypeNoTrap(pRStack_18);
  } while( true );
}

Assistant:

BOOL JavascriptOperators::GetProperty_InternalSimple(Var instance, RecyclableObject* object, PropertyId propertyId, _Outptr_result_maybenull_ Var* value, ScriptContext* requestContext)
    {
        BOOL foundProperty = FALSE;
        Assert(value != nullptr);

        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, nullptr, requestContext);
            if (result != PropertyQueryFlags::Property_NotFound)
            {
                foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                break;
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (!foundProperty)
        {
            *value = requestContext->GetMissingPropertyResult();
        }

        return foundProperty;
    }